

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConeShape.h
# Opt level: O3

char * __thiscall
cbtConeShape::serialize(cbtConeShape *this,void *dataBuffer,cbtSerializer *serializer)

{
  int i;
  long lVar1;
  cbtConvexInternalShapeData *shapeData;
  
  cbtCollisionShape::serialize((cbtCollisionShape *)this,dataBuffer,serializer);
  lVar1 = 0;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar1 * 4 + 0x20) =
         (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    *(undefined4 *)((long)dataBuffer + lVar1 * 4 + 0x10) =
         *(undefined4 *)
          ((long)(&(this->super_cbtConvexInternalShape).m_implicitShapeDimensions + -1) + lVar1 * 4)
    ;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(cbtScalar *)((long)dataBuffer + 0x30) = (this->super_cbtConvexInternalShape).m_collisionMargin;
  *(undefined4 *)((long)dataBuffer + 0x34) = 0;
  *(int *)((long)dataBuffer + 0x38) = this->m_coneIndices[1];
  *(undefined4 *)((long)dataBuffer + 0x3c) = 0;
  return "cbtConeShapeData";
}

Assistant:

SIMD_FORCE_INLINE const char* cbtConeShape::serialize(void* dataBuffer, cbtSerializer* serializer) const
{
	cbtConeShapeData* shapeData = (cbtConeShapeData*)dataBuffer;

	cbtConvexInternalShape::serialize(&shapeData->m_convexInternalShapeData, serializer);

	shapeData->m_upIndex = m_coneIndices[1];

	// Fill padding with zeros to appease msan.
	shapeData->m_padding[0] = 0;
	shapeData->m_padding[1] = 0;
	shapeData->m_padding[2] = 0;
	shapeData->m_padding[3] = 0;

	return "cbtConeShapeData";
}